

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
NpyArray::CreateHeaderNPY
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,shape_t *shape,char type,
          size_t wordSize)

{
  int iVar1;
  size_type sVar2;
  size_type __n;
  size_t i;
  ulong uVar3;
  value_type local_a9;
  vector<char,_std::allocator<char>_> dict;
  string local_90;
  string local_70;
  string local_50;
  
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  add(&dict,"{\'descr\': \'");
  add<char>(&dict,'<');
  add<char>(&dict,type);
  std::__cxx11::to_string(&local_70,wordSize);
  add(&dict,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  add(&dict,"\', \'fortran_order\': False, \'shape\': (");
  std::__cxx11::to_string
            (&local_90,
             *(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start);
  add(&dict,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  for (uVar3 = 1;
      uVar3 < (ulong)((long)(shape->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(shape->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    add(&dict,", ");
    std::__cxx11::to_string
              (&local_50,
               (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
    add(&dict,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  add(&dict,"), }");
  iVar1 = (int)((long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  sVar2 = 0x10 - (ulong)(iVar1 + 10U & 0xf);
  uVar3 = ((long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start) + sVar2;
  __n = 0x10 - (ulong)(iVar1 + 0xcU & 0xf);
  if (uVar3 < 0x10000) {
    __n = sVar2;
  }
  local_a9 = ' ';
  std::vector<char,_std::allocator<char>_>::insert
            (&dict,(const_iterator)
                   dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__n,&local_a9);
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish[-1]
       = '\n';
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add<char>(__return_storage_ptr__,-0x6d);
  add(__return_storage_ptr__,"NUMPY");
  add<char>(__return_storage_ptr__,'\x02' - (uVar3 < 0x10000));
  add<char>(__return_storage_ptr__,'\0');
  if (uVar3 < 0x10000) {
    add<unsigned_short>(__return_storage_ptr__,
                        (unsigned_short)
                        ((long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start));
  }
  else {
    add<unsigned_int>(__return_storage_ptr__,
                      (uint)((long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start));
  }
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                      dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&dict.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> NpyArray::CreateHeaderNPY(const shape_t& shape, char type, size_t wordSize)
{
	std::vector<char> dict;
	add(dict, "{'descr': '");
	#if __BYTE_ORDER == __LITTLE_ENDIAN
	add(dict, '<');
	#else
	add(dict, '>');
	#endif
	add(dict, type);
	add(dict, std::to_string(wordSize));
	add(dict, "', 'fortran_order': False, 'shape': (");
	add(dict, std::to_string(shape[0]));
	for (size_t i = 1; i < shape.size(); i++) {
		add(dict, ", ");
		add(dict, std::to_string(shape[i]));
	}
	add(dict, "), }");
	// pad with spaces so that preamble+dict is modulo 16 bytes
	// preamble is 10/12 bytes and dict needs to end with \n
	char ver = 1;
	size_t remainder = 16 - (10 + dict.size()) % 16;
	if (dict.size() + remainder > 65535) {
		ver = 2;
		remainder = 16 - (12 + dict.size()) % 16;
	}
	dict.insert(dict.end(), remainder, ' ');
	dict.back() = '\n';

	std::vector<char> header;
	add(header, (char)0x93);
	add(header, "NUMPY");
	add(header, ver); // major version of numpy format
	add(header, (char)0); // minor version of numpy format
	if (ver == 1)
		add(header, (uint16_t)dict.size());
	else
		add(header, (uint32_t)dict.size());
	header.insert(header.end(), dict.begin(), dict.end());
	return header;
}